

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

void __thiscall
slang::syntax::ParenthesizedBinsSelectExprSyntax::setChild
          (ParenthesizedBinsSelectExprSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  Token TVar2;
  BinsSelectExpressionSyntax *local_148;
  string local_120;
  allocator<char> local_e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined8 local_48;
  Info *local_40;
  BinsSelectExpressionSyntax *local_38;
  BinsSelectExpressionSyntax *local_30;
  undefined8 local_28;
  Info *local_20;
  size_t local_18;
  size_t index_local;
  ParenthesizedBinsSelectExprSyntax *this_local;
  
  local_18 = index;
  index_local = (size_t)this;
  if (index == 0) {
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_28 = TVar2._0_8_;
    (this->openParen).kind = (undefined2)local_28;
    (this->openParen).field_0x2 = local_28._2_1_;
    (this->openParen).numFlags = (NumericTokenFlags)local_28._3_1_;
    (this->openParen).rawLen = local_28._4_4_;
    local_20 = TVar2.info;
    (this->openParen).info = local_20;
  }
  else if (index == 1) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_148 = (BinsSelectExpressionSyntax *)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_148 = SyntaxNode::as<slang::syntax::BinsSelectExpressionSyntax>(pSVar1);
    }
    local_38 = local_148;
    not_null<slang::syntax::BinsSelectExpressionSyntax*>::
    not_null<slang::syntax::BinsSelectExpressionSyntax*,void>
              ((not_null<slang::syntax::BinsSelectExpressionSyntax*> *)&local_30,&local_38);
    (this->expr).ptr = local_30;
  }
  else {
    if (index != 2) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O0/extern/slang/source/AllSyntax.cpp"
                 ,&local_e9);
      std::operator+(&local_c8,&local_e8,":");
      std::__cxx11::to_string(&local_120,0x2621);
      std::operator+(&local_a8,&local_c8,&local_120);
      std::operator+(&local_88,&local_a8,": ");
      std::operator+(&local_68,&local_88,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_68);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    TVar2 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    local_48 = TVar2._0_8_;
    (this->closeParen).kind = (undefined2)local_48;
    (this->closeParen).field_0x2 = local_48._2_1_;
    (this->closeParen).numFlags = (NumericTokenFlags)local_48._3_1_;
    (this->closeParen).rawLen = local_48._4_4_;
    local_40 = TVar2.info;
    (this->closeParen).info = local_40;
  }
  return;
}

Assistant:

void ParenthesizedBinsSelectExprSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: openParen = child.token(); return;
        case 1: expr = child.node() ? &child.node()->as<BinsSelectExpressionSyntax>() : nullptr; return;
        case 2: closeParen = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}